

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::RetentionStripTest_StripSourceRetentionFieldOptions_Test
::TestBody(RetentionStripTest_StripSourceRetentionFieldOptions_Test *this)

{
  FileDescriptor *this_00;
  Descriptor *this_01;
  FieldDescriptor *field;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar1;
  EqualsProtoMatcherP<google::protobuf::FieldOptions> *matcher;
  EqualsProtoMatcherP<google::protobuf::FieldOptions> *matcher_00;
  EqualsProtoMatcherP<google::protobuf::FieldOptions> *matcher_01;
  EqualsProtoMatcherP<google::protobuf::FieldOptions> *matcher_02;
  char *pcVar2;
  string_view contents;
  string_view name;
  string_view name_00;
  string_view data;
  string_view file_name;
  AssertionResult gtest_ar;
  FieldOptions local_708;
  undefined1 local_670 [48];
  RepeatedPtrFieldBase local_640 [8];
  FieldOptions expected_options;
  FieldOptions local_4e0;
  FieldOptions local_448;
  FieldOptions local_3b0;
  FieldOptions local_318;
  FieldOptions local_280;
  FieldOptions local_1e8;
  FieldOptions local_150;
  FieldOptions local_b8;
  
  contents._M_str =
       "\n      message TestMessage {\n        optional string test_field = 1 [(source_retention_option) = 123, (options) = {\n          i1: 123\n          i2: 456\n          c { s: \"abc\" }\n          rc { s: \"abc\" }\n        }, (repeated_options) = {\n          i1: 111 i2: 222\n        }];\n      }\n\n      message Options {\n        optional int32 i1 = 1 [retention = RETENTION_SOURCE];\n        optional int32 i2 = 2;\n        message ChildMessage {\n          optional string s = 1 [retention = RETENTION_SOURCE];\n        }\n        optional ChildMessage c = 3;\n        repeated ChildMessage rc = 4;\n      }\n\n      extend google.protobuf.FieldOptions {\n        optional int32 source_retention_option = 50000 [retention = RETENTION_SOURCE];\n        optional Options options = 50001;\n        repeated Options repeated_options = 50002;\n      }"
  ;
  contents._M_len = 0x335;
  file_name._M_str = "foo.proto";
  file_name._M_len = 9;
  this_00 = RetentionStripTest::ParseSchema(&this->super_RetentionStripTest,contents,file_name);
  data._M_str = 
  "\n        [google.protobuf.internal.options] {\n          i2: 456\n          c {}\n          rc {}\n        }\n        [google.protobuf.internal.repeated_options] { i2: 222 }"
  ;
  data._M_len = 0xa8;
  RetentionStripTest::BuildDynamicProto<google::protobuf::FieldOptions>
            (&expected_options,&this->super_RetentionStripTest,data);
  name._M_str = "TestMessage";
  name._M_len = 0xb;
  local_670._0_8_ = FileDescriptor::FindMessageTypeByName(this_00,name);
  this_01 = absl::lts_20250127::log_internal::DieIfNull<google::protobuf::Descriptor_const*>
                      ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
                       ,0x189,"file->FindMessageTypeByName(\"TestMessage\")",
                       (Descriptor **)local_670);
  name_00._M_str = "test_field";
  name_00._M_len = 10;
  local_670._0_8_ = Descriptor::FindFieldByName(this_01,name_00);
  field = absl::lts_20250127::log_internal::DieIfNull<google::protobuf::FieldDescriptor_const*>
                    ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
                     ,0x18b,"message->FindFieldByName(\"test_field\")",(FieldDescriptor **)local_670
                    );
  FieldOptions::FieldOptions(&local_318,&expected_options);
  EqualsProto<google::protobuf::FieldOptions>
            ((EqualsProtoMatcherP<google::protobuf::FieldOptions> *)&local_b8,&local_318);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>>
            ((PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>_>
              *)&local_708,(internal *)&local_b8,matcher);
  StripSourceRetentionOptions((FileDescriptorProto *)local_670,this_00,false);
  pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     (local_640,0);
  protobuf::internal::RepeatedPtrFieldBase::
  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
            (&(pVVar1->field_0)._impl_.field_.super_RepeatedPtrFieldBase,0);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>>
  ::operator()(&gtest_ar,(char *)&local_708,
               (FieldOptions *)
               "StripSourceRetentionOptions(*file).message_type(0).field(0).options()");
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_670);
  FieldOptions::~FieldOptions(&local_708);
  FieldOptions::~FieldOptions(&local_b8);
  FieldOptions::~FieldOptions(&local_318);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_670);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_708,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
               ,399,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_708,(Message *)local_670);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_708);
    if ((Descriptor *)local_670._0_8_ != (Descriptor *)0x0) {
      (**(code **)(*(long *)local_670._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  FieldOptions::FieldOptions(&local_3b0,&expected_options);
  EqualsProto<google::protobuf::FieldOptions>
            ((EqualsProtoMatcherP<google::protobuf::FieldOptions> *)&local_150,&local_3b0);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>>
            ((PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>_>
              *)&local_708,(internal *)&local_150,matcher_00);
  StripSourceRetentionOptions((DescriptorProto *)local_670,this_01);
  protobuf::internal::RepeatedPtrFieldBase::
  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
            ((RepeatedPtrFieldBase *)(local_670 + 0x18),0);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>>
  ::operator()(&gtest_ar,(char *)&local_708,
               (FieldOptions *)"StripSourceRetentionOptions(*message).field(0).options()");
  DescriptorProto::~DescriptorProto((DescriptorProto *)local_670);
  FieldOptions::~FieldOptions(&local_708);
  FieldOptions::~FieldOptions(&local_150);
  FieldOptions::~FieldOptions(&local_3b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_670);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_708,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
               ,0x191,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_708,(Message *)local_670);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_708);
    if ((Descriptor *)local_670._0_8_ != (Descriptor *)0x0) {
      (**(code **)(*(long *)local_670._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  FieldOptions::FieldOptions(&local_448,&expected_options);
  EqualsProto<google::protobuf::FieldOptions>
            ((EqualsProtoMatcherP<google::protobuf::FieldOptions> *)&local_1e8,&local_448);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>>
            ((PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>_>
              *)local_670,(internal *)&local_1e8,matcher_01);
  StripSourceRetentionOptions((FieldDescriptorProto *)&local_708,field);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>>
  ::operator()(&gtest_ar,local_670,(FieldOptions *)"StripSourceRetentionOptions(*field).options()");
  FieldDescriptorProto::~FieldDescriptorProto((FieldDescriptorProto *)&local_708);
  FieldOptions::~FieldOptions((FieldOptions *)local_670);
  FieldOptions::~FieldOptions(&local_1e8);
  FieldOptions::~FieldOptions(&local_448);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_670);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_708,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
               ,0x193,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_708,(Message *)local_670);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_708);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_670._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_670._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  FieldOptions::FieldOptions(&local_4e0,&expected_options);
  EqualsProto<google::protobuf::FieldOptions>
            ((EqualsProtoMatcherP<google::protobuf::FieldOptions> *)&local_280,&local_4e0);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>>
            ((PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>_>
              *)local_670,(internal *)&local_280,matcher_02);
  StripLocalSourceRetentionOptions(&local_708,field);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>>
  ::operator()(&gtest_ar,local_670,(FieldOptions *)"StripLocalSourceRetentionOptions(*field)");
  FieldOptions::~FieldOptions(&local_708);
  FieldOptions::~FieldOptions((FieldOptions *)local_670);
  FieldOptions::~FieldOptions(&local_280);
  FieldOptions::~FieldOptions(&local_4e0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_670);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_708,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
               ,0x195,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_708,(Message *)local_670);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_708);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_670._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_670._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  FieldOptions::~FieldOptions(&expected_options);
  return;
}

Assistant:

TEST_F(RetentionStripTest, StripSourceRetentionFieldOptions) {
  const FileDescriptor* file = ParseSchema(R"schema(
      message TestMessage {
        optional string test_field = 1 [(source_retention_option) = 123, (options) = {
          i1: 123
          i2: 456
          c { s: "abc" }
          rc { s: "abc" }
        }, (repeated_options) = {
          i1: 111 i2: 222
        }];
      }

      message Options {
        optional int32 i1 = 1 [retention = RETENTION_SOURCE];
        optional int32 i2 = 2;
        message ChildMessage {
          optional string s = 1 [retention = RETENTION_SOURCE];
        }
        optional ChildMessage c = 3;
        repeated ChildMessage rc = 4;
      }

      extend google.protobuf.FieldOptions {
        optional int32 source_retention_option = 50000 [retention = RETENTION_SOURCE];
        optional Options options = 50001;
        repeated Options repeated_options = 50002;
      })schema");

  FieldOptions expected_options = BuildDynamicProto<FieldOptions>(
      R"pb(
        [google.protobuf.internal.options] {
          i2: 456
          c {}
          rc {}
        }
        [google.protobuf.internal.repeated_options] { i2: 222 })pb");
  const Descriptor* message =
      ABSL_DIE_IF_NULL(file->FindMessageTypeByName("TestMessage"));
  const FieldDescriptor* field =
      ABSL_DIE_IF_NULL(message->FindFieldByName("test_field"));

  EXPECT_THAT(
      StripSourceRetentionOptions(*file).message_type(0).field(0).options(),
      EqualsProto(expected_options));
  EXPECT_THAT(StripSourceRetentionOptions(*message).field(0).options(),
              EqualsProto(expected_options));
  EXPECT_THAT(StripSourceRetentionOptions(*field).options(),
              EqualsProto(expected_options));
  EXPECT_THAT(StripLocalSourceRetentionOptions(*field),
              EqualsProto(expected_options));
}